

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_template.cpp
# Opt level: O1

TemplateDecls * __thiscall
pfederc::Parser::parseTemplateDecl(TemplateDecls *__return_storage_ptr__,Parser *this)

{
  Lexer *pLVar1;
  Token *pTVar2;
  pointer pcVar3;
  size_t sVar4;
  istream *piVar5;
  _func_int ***ppp_Var6;
  Lexer *pLVar7;
  _Base_ptr p_Var8;
  bool bVar9;
  _Base_ptr p_Var10;
  bool bVar11;
  unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> templdecl;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> templdecl_1;
  _Head_base<0UL,_pfederc::TemplateDecl_*,_false> local_70;
  Lexer *local_68;
  Lexer *local_60;
  _Rb_tree_node_base local_58;
  
  local_58._M_right = (_Base_ptr)__return_storage_ptr__;
  sanityExpect(this,TOK_OP_TEMPL_BRACKET_OPEN);
  bVar11 = false;
  parseExpression((Parser *)&local_68,(Precedence)this);
  local_58._0_8_ = (pointer)0x0;
  local_58._M_parent = (_Base_ptr)0x0;
  local_58._M_left = (_Base_ptr)0x0;
  if (local_68 != (Lexer *)0x0) {
    bVar11 = false;
    do {
      pLVar7 = local_68;
      if (*(int *)&(local_68->filePath)._M_dataplus._M_p != 0x12) break;
      if (local_68->_vptr_Lexer != (_func_int **)&PTR__BiOpExpr_0012b998) {
        __cxa_bad_cast();
      }
      if ((short)(local_68->fileContent)._M_string_length != 0x2e) break;
      if (local_68->_vptr_Lexer != (_func_int **)&PTR__BiOpExpr_0012b998) {
        __cxa_bad_cast();
      }
      local_70._M_head_impl = *(TemplateDecl **)((long)&(local_68->fileContent).field_2 + 8);
      *(undefined8 *)((long)&(local_68->fileContent).field_2 + 8) = 0;
      fromExprToTemplateDecl
                ((Parser *)&local_60,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this);
      if (local_60 == (Lexer *)0x0) {
        bVar11 = true;
      }
      else {
        std::
        vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
        ::_M_insert_rval((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                          *)&local_58,(const_iterator)local_58._0_8_,(value_type *)&local_60);
      }
      pLVar1 = *(Lexer **)&(pLVar7->fileContent).field_2;
      (pLVar7->fileContent).field_2._M_allocated_capacity = 0;
      if (local_68 != (Lexer *)0x0) {
        ppp_Var6 = &local_68->_vptr_Lexer;
        local_68 = pLVar1;
        (*(*ppp_Var6)[1])();
        pLVar1 = local_68;
      }
      local_68 = pLVar1;
      if (local_60 != (Lexer *)0x0) {
        std::default_delete<pfederc::TemplateDecl>::operator()
                  ((default_delete<pfederc::TemplateDecl> *)&local_60,(TemplateDecl *)local_60);
      }
      if ((Lexer *)local_70._M_head_impl != (Lexer *)0x0) {
        (*(code *)((((local_70._M_head_impl)->id)._M_t.
                    super___uniq_ptr_impl<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_pfederc::TokenExpr_*,_std::default_delete<pfederc::TokenExpr>_>
                    .super__Head_base<0UL,_pfederc::TokenExpr_*,_false>._M_head_impl)->super_Expr).
                  parent)();
      }
    } while (local_68 != (Lexer *)0x0);
  }
  fromExprToTemplateDecl
            ((Parser *)&local_70,
             (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this);
  if ((Lexer *)local_70._M_head_impl == (Lexer *)0x0) {
    bVar11 = true;
  }
  else {
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::_M_insert_rval((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                      *)&local_58,(const_iterator)local_58._0_8_,(value_type *)&local_70);
  }
  bVar9 = expect(this,TOK_TEMPL_BRACKET_CLOSE);
  if (!bVar9) {
    pTVar2 = this->lexer->currentToken;
    local_60 = (Lexer *)operator_new(0x38);
    sVar4 = (pTVar2->pos).line;
    piVar5 = (istream *)(pTVar2->pos).startIndex;
    pcVar3 = (pointer)(pTVar2->pos).endIndex;
    *(Level *)&local_60->_vptr_Lexer = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&local_60->_vptr_Lexer + 4) = STX_ERR_EXPECTED_TEMPL_CLOSING_BRACKET;
    ((Position *)&local_60->cfg)->line = sVar4;
    local_60->input = piVar5;
    (local_60->filePath)._M_dataplus._M_p = pcVar3;
    (local_60->filePath)._M_string_length = 0;
    (local_60->filePath).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(local_60->filePath).field_2 + 8) = 0;
    generateError((Parser *)&stack0xffffffffffffffc8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffc8);
    if (local_60 != (Lexer *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_60,
                 (Error<pfederc::SyntaxErrorCode> *)local_60);
    }
    bVar11 = true;
  }
  p_Var8 = local_58._M_right;
  p_Var10 = local_58._M_right;
  if (!bVar11) {
    p_Var10 = &local_58;
    (local_58._M_right)->_M_color = local_58._M_color;
    *(undefined4 *)&(local_58._M_right)->field_0x4 = local_58._4_4_;
    (local_58._M_right)->_M_parent = local_58._M_parent;
    (local_58._M_right)->_M_left = local_58._M_left;
  }
  *(undefined8 *)p_Var10 = 0;
  p_Var10->_M_parent = (_Base_ptr)0x0;
  p_Var10->_M_left = (_Base_ptr)0x0;
  if ((Lexer *)local_70._M_head_impl != (Lexer *)0x0) {
    std::default_delete<pfederc::TemplateDecl>::operator()
              ((default_delete<pfederc::TemplateDecl> *)&local_70,local_70._M_head_impl);
  }
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
             *)&local_58);
  if (local_68 != (Lexer *)0x0) {
    (*local_68->_vptr_Lexer[1])();
  }
  return (TemplateDecls *)p_Var8;
}

Assistant:

TemplateDecls Parser::parseTemplateDecl() noexcept {
  sanityExpect(TokenType::TOK_OP_TEMPL_BRACKET_OPEN);

  bool err = false;

  std::unique_ptr<Expr> expr(parseExpression());
  TemplateDecls result;

  while (expr && isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    std::unique_ptr<Expr> rhs(biopexpr.getRightPtr());

    std::unique_ptr<TemplateDecl> templdecl(fromExprToTemplateDecl(std::move(rhs)));
    if (!templdecl)
      err = true;
    else
      // success, push on result
      result.insert(result.begin(), std::move(templdecl));

    // next iterator step
    expr = biopexpr.getLeftPtr();
  }
  
  std::unique_ptr<TemplateDecl> templdecl(fromExprToTemplateDecl(std::move(expr)));
  if (!templdecl)
    err = true;
  // success, push on result
  else
    result.insert(result.begin(), std::move(templdecl));

  if (!expect(TokenType::TOK_TEMPL_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_TEMPL_CLOSING_BRACKET,
          lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  if (err)
    return TemplateDecls();

  return result;
}